

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void warp_horizontal_filter_alpha0_avx2
               (uint8_t *ref,__m256i *horz_out,int stride,int32_t ix4,int32_t iy4,int32_t sx4,
               int alpha,int beta,int p_height,int height,int i,__m256i *round_const,__m128i *shift,
               __m256i *shuffle_src)

{
  undefined1 (*pauVar1) [12];
  undefined1 auVar2 [16];
  __m256i src;
  __m256i src_00;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  int iVar5;
  int in_ECX;
  int in_EDX;
  longlong unaff_RBP;
  long in_RDI;
  int in_R8D;
  undefined1 in_stack_00000000 [16];
  undefined4 in_stack_00000014;
  __m128i src_1;
  __m128i src_0;
  __m256i coeff [4];
  int row;
  int sx;
  int iy;
  int k;
  int local_188;
  __m256i *in_stack_fffffffffffffe98;
  undefined8 uVar6;
  undefined1 in_stack_fffffffffffffea0 [32];
  int local_8c;
  int in_stack_ffffffffffffffcc;
  __m128i *in_stack_ffffffffffffffd0;
  __m256i *in_stack_ffffffffffffffd8;
  __m256i *in_stack_ffffffffffffffe0;
  __m256i *in_stack_ffffffffffffffe8;
  __m256i *in_stack_fffffffffffffff0;
  
  local_8c = -7;
  while( true ) {
    uVar6 = in_stack_fffffffffffffea0._0_8_;
    if (beta - height < 9) {
      local_188 = beta - height;
    }
    else {
      local_188 = 8;
    }
    if (local_188 + -2 < local_8c) break;
    iVar5 = clamp(in_R8D + local_8c,0,p_height + -1);
    pauVar1 = (undefined1 (*) [12])((long)in_ECX + -7 + in_RDI + iVar5 * in_EDX);
    uVar6 = *(undefined8 *)(*pauVar1 + 8);
    auVar3 = *pauVar1;
    iVar5 = clamp(in_R8D + 1 + local_8c,0,p_height + -1);
    auVar4 = *(undefined1 (*) [16])((long)in_ECX + -7 + in_RDI + iVar5 * in_EDX);
    in_stack_ffffffffffffffcc = (int)((ulong)uVar6 >> 0x20);
    auVar2._12_4_ = in_stack_ffffffffffffffcc;
    auVar2._0_12_ = auVar3;
    in_stack_fffffffffffffea0._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar2;
    in_stack_fffffffffffffea0._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
    prepare_horizontal_filter_coeff_alpha0_avx2
              (in_stack_fffffffffffffea0._4_4_,in_stack_fffffffffffffea0._0_4_,
               in_stack_fffffffffffffe98);
    src[3]._0_4_ = alpha;
    src._8_16_ = in_stack_00000000;
    src[3]._4_4_ = in_stack_00000014;
    src[0] = unaff_RBP;
    filter_src_pixels_avx2
              (src,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_8c = local_8c + 2;
  }
  clamp(in_R8D + local_8c,0,p_height + -1);
  prepare_horizontal_filter_coeff_alpha0_avx2((int)((ulong)uVar6 >> 0x20),(int)uVar6,(__m256i *)0x0)
  ;
  src_00[3]._0_4_ = alpha;
  src_00._8_16_ = in_stack_00000000;
  src_00[3]._4_4_ = in_stack_00000014;
  src_00[0] = unaff_RBP;
  filter_src_pixels_avx2
            (src_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

static inline void warp_horizontal_filter_alpha0_avx2(
    const uint8_t *ref, __m256i *horz_out, int stride, int32_t ix4, int32_t iy4,
    int32_t sx4, int alpha, int beta, int p_height, int height, int i,
    const __m256i *round_const, const __m128i *shift,
    const __m256i *shuffle_src) {
  (void)alpha;
  int k, iy, sx, row = 0;
  __m256i coeff[4];
  for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
    iy = iy4 + k;
    iy = clamp(iy, 0, height - 1);
    const __m128i src_0 =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    iy = iy4 + k + 1;
    iy = clamp(iy, 0, height - 1);
    const __m128i src_1 =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    const __m256i src_01 =
        _mm256_inserti128_si256(_mm256_castsi128_si256(src_0), src_1, 0x1);
    sx = sx4 + beta * (k + 4);
    prepare_horizontal_filter_coeff_alpha0_avx2(beta, sx, coeff);
    filter_src_pixels_avx2(src_01, horz_out, coeff, shuffle_src, round_const,
                           shift, row);
    row += 1;
  }
  iy = iy4 + k;
  iy = clamp(iy, 0, height - 1);
  const __m256i src_01 = _mm256_castsi128_si256(
      _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7)));
  sx = sx4 + beta * (k + 4);
  prepare_horizontal_filter_coeff_alpha0_avx2(beta, sx, coeff);
  filter_src_pixels_avx2(src_01, horz_out, coeff, shuffle_src, round_const,
                         shift, row);
}